

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O2

void __thiscall
sptk::reaper::LpcAnalyzer::Durbin(LpcAnalyzer *this,float *r,float *k,float *a,int p,float *ex)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  float fVar7;
  float local_1a8 [102];
  
  fVar1 = *r;
  fVar7 = -r[1] / fVar1;
  *k = fVar7;
  *a = fVar7;
  fVar1 = fVar1 * (1.0 - *k * *k);
  lVar4 = 2;
  pfVar5 = local_1a8;
  lVar6 = 1;
  while (lVar6 < p) {
    fVar7 = 0.0;
    lVar2 = lVar6;
    pfVar3 = a;
    while (lVar2 != 0) {
      fVar7 = fVar7 - *pfVar3 * r[lVar2];
      pfVar3 = pfVar3 + 1;
      lVar2 = lVar2 + -1;
    }
    fVar7 = (fVar7 - r[lVar6 + 1]) / fVar1;
    k[lVar6] = fVar7;
    a[lVar6] = fVar7;
    for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
      local_1a8[lVar2] = a[lVar2];
    }
    pfVar3 = pfVar5;
    for (lVar2 = 0; fVar7 = k[lVar6], lVar6 != lVar2; lVar2 = lVar2 + 1) {
      a[lVar2] = fVar7 * *pfVar3 + a[lVar2];
      pfVar3 = pfVar3 + -1;
    }
    fVar1 = fVar1 * (1.0 - fVar7 * fVar7);
    lVar4 = lVar4 + 1;
    pfVar5 = pfVar5 + 1;
    lVar6 = lVar6 + 1;
  }
  *ex = fVar1;
  return;
}

Assistant:

void LpcAnalyzer::Durbin(float* r, float* k, float* a, int p, float* ex) {
  float  bb[BIGSORD];
  int i, j;
  float e, s, *b = bb;

  e = *r;
  *k = -r[1] / e;
  *a = *k;
  e *= (1.0 - (*k) * (*k));
  for (i = 1; i < p; i++) {
    s = 0;
    for (j = 0; j < i; j++) {
      s -= a[j] * r[i - j];
    }
    k[i] = (s - r[i + 1]) / e;
    a[i] = k[i];
    for (j = 0; j <= i; j++) {
      b[j] = a[j];
    }
    for (j = 0; j < i; j++) {
      a[j] += k[i] * b[i - j - 1];
    }
    e *= (1.0 - (k[i] * k[i]));
  }
  *ex = e;
}